

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl2.cpp
# Opt level: O2

void E64::sdl2_wait_until_f9_released(void)

{
  int iVar1;
  int iVar2;
  SDL_Event event;
  duration<long,_std::ratio<1L,_1000000L>_> local_60;
  int local_58 [5];
  int local_44;
  
  do {
    do {
      SDL_PollEvent(local_58);
      iVar2 = local_44;
      iVar1 = local_58[0];
      local_60.__r = 40000;
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_60);
    } while (iVar1 != 0x301);
  } while (iVar2 != 0x40000042);
  return;
}

Assistant:

void E64::sdl2_wait_until_f9_released()
{
    SDL_Event event;
    bool wait = true;
    while(wait) {
        SDL_PollEvent(&event);
        if( (event.type == SDL_KEYUP) && (event.key.keysym.sym == SDLK_F9) ) wait = false;
        std::this_thread::sleep_for(std::chrono::microseconds(40000));
    }
}